

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  xpath_ast_node *this_00;
  xpath_allocator *this_01;
  uint uVar1;
  undefined8 __s;
  bool bVar2;
  int iVar3;
  xml_node_struct *pxVar4;
  xpath_ast_node **ppxVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  size_t sVar10;
  char_t *pcVar11;
  byte *pbVar12;
  long lVar13;
  xml_attribute xVar14;
  char *pcVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  uint uVar19;
  xpath_ast_node **ppxVar20;
  char_t *pcVar21;
  byte bVar22;
  xpath_string *pxVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  xml_node xVar28;
  undefined1 auVar29 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  xpath_node xVar30;
  xpath_allocator_capture local_d8;
  xpath_string *local_b0;
  undefined1 local_a8 [16];
  xpath_node *local_98;
  xpath_string *local_88;
  double v;
  xml_attribute local_78;
  undefined1 local_68 [24];
  long local_50;
  xpath_stack *local_48;
  xpath_stack local_40;
  
  auVar26 = in_ZMM3._0_16_;
  auVar29 = in_ZMM2._0_16_;
LAB_00122534:
  switch(this->_type) {
  case '\x12':
    pcVar15 = (char *)this->_data;
LAB_00122ae2:
    __return_storage_ptr__->_buffer = (char_t *)pcVar15;
LAB_00122ae5:
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    return __return_storage_ptr__;
  default:
    bVar22 = this->_rettype;
    break;
  case '\x14':
    bVar22 = this->_rettype;
    if (((this->_data).variable)->_type != (uint)bVar22) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2a3b,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (bVar22 == 3) {
      pcVar21 = *(char_t **)((this->_data).variable + 1);
      pcVar11 = "";
      if (pcVar21 != (char_t *)0x0) {
        pcVar11 = pcVar21;
      }
      __return_storage_ptr__->_buffer = pcVar11;
      goto LAB_00122ae5;
    }
    break;
  case '\x19':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar15 = (char *)local_name((xpath_node *)&local_d8);
    goto LAB_00122ae2;
  case '\x1a':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    pcVar21 = local_name((xpath_node *)local_68);
    goto LAB_00122ebf;
  case '\x1b':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar15 = (char *)namespace_uri((xpath_node *)&local_d8);
    goto LAB_00122ae2;
  case '\x1c':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    pcVar21 = namespace_uri((xpath_node *)local_68);
    goto LAB_00122ebf;
  case '\x1d':
    pxVar4 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar4 == (xml_node_struct *)0x0) &&
       (pxVar4 = (c->n)._node._root, pxVar4 == (xml_node_struct *)0x0)) goto LAB_00122adb;
    pcVar15 = (char *)"";
    if (pxVar4->name != (char_t *)0x0) {
      pcVar15 = (char *)pxVar4->name;
    }
    goto LAB_00122ae2;
  case '\x1e':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    xVar30 = xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    xVar14._attr = xVar30._attribute._attr._attr;
    if ((xVar30._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar14._attr = (xml_attribute_struct *)xVar30._node._root._root,
       xVar30._node._root._root == (xml_node_struct *)0x0)) goto LAB_00122eb8;
    pcVar21 = "";
    if (((xml_node_struct *)xVar14._attr)->name != (char_t *)0x0) {
      pcVar21 = ((xml_node_struct *)xVar14._attr)->name;
    }
    goto LAB_00122ebf;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    return __return_storage_ptr__;
  case ' ':
    goto switchD_0012254c_caseD_20;
  case '!':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    sVar6 = 0x18;
    lVar13 = 0;
    ppxVar20 = &this->_right;
    for (ppxVar5 = ppxVar20; *ppxVar5 != (xpath_ast_node *)0x0; ppxVar5 = &(*ppxVar5)->_next) {
      lVar13 = lVar13 + 1;
      sVar6 = sVar6 + 0x18;
    }
    local_b0 = __return_storage_ptr__;
    local_88 = (xpath_string *)xpath_allocator::allocate(local_d8._target,sVar6);
    __return_storage_ptr__ = local_b0;
    if (local_88 != (xpath_string *)0x0) {
      local_68._0_16_ = vpermilps_avx((undefined1  [16])*stack,0x4e);
      local_48 = stack;
      eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
      local_50 = lVar13 + 1;
      local_88->_length_heap = (size_t)local_98;
      local_88->_buffer = (char_t *)local_a8._0_8_;
      *(ulong *)&local_88->_uses_heap = CONCAT71(local_a8._9_7_,local_a8[8]);
      pxVar23 = local_88;
      while( true ) {
        this_00 = *ppxVar20;
        if (this_00 == (xpath_ast_node *)0x0) break;
        eval_string((xpath_string *)local_a8,this_00,c,(xpath_stack *)local_68);
        ppxVar20 = &this_00->_next;
        lVar13 = lVar13 + -1;
        pxVar23[1]._length_heap = (size_t)local_98;
        pxVar23[1]._buffer = (char_t *)local_a8._0_8_;
        *(ulong *)&pxVar23[1]._uses_heap = CONCAT71(local_a8._9_7_,local_a8[8]);
        pxVar23 = pxVar23 + 1;
      }
      if (lVar13 != 0) {
        __assert_fail("pos == count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2959,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                     );
      }
      lVar17 = 0;
      lVar13 = local_50;
      pxVar23 = local_88;
      while (bVar2 = lVar13 != 0, lVar13 = lVar13 + -1, bVar2) {
        sVar6 = xpath_string::length(pxVar23);
        lVar17 = lVar17 + sVar6;
        pxVar23 = pxVar23 + 1;
      }
      pbVar9 = (byte *)xpath_allocator::allocate(local_48->result,lVar17 + 1);
      __return_storage_ptr__ = local_b0;
      if (pbVar9 == (byte *)0x0) goto LAB_00122eb8;
      pbVar18 = pbVar9;
      for (lVar13 = 0; local_50 != lVar13; lVar13 = lVar13 + 1) {
        for (pbVar16 = local_88[lVar13]._buffer; *pbVar16 != 0; pbVar16 = pbVar16 + 1) {
          *pbVar18 = *pbVar16;
          pbVar18 = pbVar18 + 1;
        }
      }
      *pbVar18 = 0;
      goto LAB_00122eac;
    }
LAB_00122eb8:
    pcVar21 = "";
LAB_00122ebf:
    __return_storage_ptr__->_buffer = pcVar21;
LAB_00122ec2:
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    goto LAB_00122ecc;
  case '$':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_78._attr = (xml_attribute_struct *)stack->result;
    v = (double)local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)&v);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)&v);
    pcVar21 = (char_t *)strstr((char *)local_a8._0_8_,(char *)local_68._0_8_);
    if (pcVar21 == (char_t *)0x0) goto LAB_00122eb8;
    xpath_string::from_heap(__return_storage_ptr__,(char_t *)local_a8._0_8_,pcVar21,stack->result);
    goto LAB_00122ecc;
  case '%':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_78._attr = (xml_attribute_struct *)stack->result;
    v = (double)local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)&v);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)&v);
    pcVar15 = strstr((char *)local_a8._0_8_,(char *)local_68._0_8_);
    if (pcVar15 == (char *)0x0) {
      pcVar21 = "";
    }
    else {
      sVar6 = xpath_string::length((xpath_string *)local_68);
      pcVar21 = (char_t *)(pcVar15 + sVar6);
      sVar6 = xpath_string::length((xpath_string *)local_a8);
      if (local_a8[8] == true) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar21,(char_t *)(local_a8._0_8_ + sVar6),stack->result);
        goto LAB_00122ecc;
      }
    }
    __return_storage_ptr__->_buffer = pcVar21;
    goto LAB_00122ec2;
  case '&':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    sVar6 = xpath_string::length((xpath_string *)local_a8);
    dVar24 = eval_number(this->_right,c,stack);
    pcVar21 = "";
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar24 + 0.5;
    auVar26 = vroundsd_avx(auVar26,auVar26,9);
    v = (double)auVar26._0_8_;
    auVar29 = vcvtusi2sd_avx512f(auVar29,sVar6 + 1);
    if ((double)auVar26._0_8_ < auVar29._0_8_) {
      auVar29 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar26);
      lVar13 = vcvttsd2usi_avx512f(auVar29);
      if (sVar6 + 1 <= lVar13 - 1U) {
        __assert_fail("1 <= pos && pos <= s_length + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x29e0,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      pcVar21 = (char_t *)(local_a8._0_8_ + lVar13 + -1);
      sVar6 = xpath_string::length((xpath_string *)local_a8);
      if (local_a8[8] == true) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar21,(char_t *)(local_a8._0_8_ + sVar6),stack->result);
        goto LAB_00122ecc;
      }
    }
    __return_storage_ptr__->_buffer = pcVar21;
    goto LAB_00122ec2;
  case '\'':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    sVar6 = xpath_string::length((xpath_string *)local_a8);
    local_b0 = (xpath_string *)eval_number(this->_right,c,stack);
    dVar24 = eval_number(this->_right->_next,c,stack);
    pcVar21 = "";
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (double)local_b0 + 0.5;
    auVar29 = vroundsd_avx(auVar29,auVar29,9);
    xVar28._root = auVar29._0_8_;
    v = (double)xVar28._root;
    if (!NAN((double)xVar28._root) && !NAN((double)xVar28._root)) {
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar24 + 0.5;
      auVar25 = vroundsd_avx(auVar25,auVar25,9);
      v = (double)xVar28._root + auVar25._0_8_;
      if (!NAN(v) && !NAN(v)) {
        uVar7 = sVar6 + 1;
        auVar26 = vcvtusi2sd_avx512f(auVar26,uVar7);
        if ((((double)xVar28._root < auVar26._0_8_) && ((double)xVar28._root < v)) && (1.0 <= v)) {
          auVar29 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar29);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = v;
          uVar8 = vcvttsd2usi_avx512f(auVar27);
          lVar13 = vcvttsd2usi_avx512f(auVar29);
          if (auVar26._0_8_ <= v) {
            uVar8 = uVar7;
          }
          if ((uVar8 <= lVar13 - 1U) || (uVar7 < uVar8)) {
            __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x29fc,
                          "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                         );
          }
          pcVar21 = (char_t *)(local_a8._0_8_ + lVar13 + -1);
          if ((uVar8 != uVar7) || (local_a8[8] == true)) {
            xpath_string::from_heap
                      (__return_storage_ptr__,pcVar21,(char_t *)(local_a8._0_8_ + (uVar8 - 1)),
                       stack->result);
            goto LAB_00122ecc;
          }
        }
      }
    }
    __return_storage_ptr__->_buffer = pcVar21;
    goto LAB_00122ec2;
  case '*':
    string_value((xpath_string *)&local_d8,&c->n,stack->result);
    goto LAB_00122925;
  case '+':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
LAB_00122925:
    pbVar9 = xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar9 != (byte *)0x0) {
      pbVar16 = normalize_space(pbVar9);
      goto LAB_00122d4b;
    }
LAB_00122adb:
    pcVar15 = (char *)"";
    goto LAB_00122ae2;
  case ',':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)&v,this->_right->_next,c,&local_40);
    pbVar9 = xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pbVar9 == (byte *)0x0) goto LAB_00122eb8;
    __s = local_68._0_8_;
    local_88 = (xpath_string *)v;
    local_b0 = __return_storage_ptr__;
    sVar6 = xpath_string::length((xpath_string *)&v);
    pbVar16 = pbVar9;
    pbVar18 = pbVar9;
    goto LAB_00122cb3;
  case ':':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
    pbVar9 = xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar9 == (byte *)0x0) goto LAB_00122adb;
    pcVar21 = (this->_data).string;
    pbVar16 = pbVar9;
    pbVar18 = pbVar9;
    while( true ) {
      bVar22 = *pbVar18;
      if ((ulong)bVar22 == 0) break;
      uVar7 = 1;
      if (-1 < (char)bVar22) {
        bVar22 = pcVar21[bVar22];
        uVar7 = (ulong)(-1 < (char)bVar22);
      }
      *pbVar16 = bVar22;
      pbVar18 = pbVar18 + 1;
      pbVar16 = pbVar16 + uVar7;
    }
    *pbVar16 = 0;
    goto LAB_00122d4b;
  }
  if (bVar22 == 1) {
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_node_set((xpath_node_set_raw *)local_a8,this,c,(xpath_stack *)local_68,nodeset_eval_first);
    if ((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]) == local_98) goto LAB_00122eb8;
    _v = xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    string_value(__return_storage_ptr__,(xpath_node *)&v,stack->result);
    goto LAB_00122ecc;
  }
  if (bVar22 != 2) {
    if (bVar22 != 4) {
      __assert_fail("false && \"Wrong expression for return type string\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2a57,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    bVar2 = eval_boolean(this,c,stack);
    pcVar15 = "false";
    if (bVar2) {
      pcVar15 = "true";
    }
    __return_storage_ptr__->_buffer = (char_t *)pcVar15;
    goto LAB_00122ae5;
  }
  local_d8._target = (xpath_allocator *)eval_number(this,c,stack);
  this_01 = stack->result;
  if (((double)local_d8._target == 0.0) && (!NAN((double)local_d8._target))) {
    pcVar15 = (char *)"0";
    goto LAB_00122ae2;
  }
  if (NAN((double)local_d8._target)) {
    pcVar15 = "NaN";
    goto LAB_00122ae2;
  }
  if (((double)local_d8._target + (double)local_d8._target == (double)local_d8._target) &&
     (!NAN((double)local_d8._target + (double)local_d8._target) && !NAN((double)local_d8._target)))
  {
    pcVar15 = "-Infinity";
    if (0.0 < (double)local_d8._target) {
      pcVar15 = "Infinity";
    }
    goto LAB_00122ae2;
  }
  local_b0 = (xpath_string *)local_d8._target;
  snprintf((char *)&local_d8,0x20,"%.*e",0xf);
  pbVar9 = (byte *)strchr((char *)&local_d8,0x65);
  if (pbVar9 == (byte *)0x0) {
    __assert_fail("exponent_string",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2037,
                  "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                 );
  }
  iVar3 = atoi((char *)(pbVar9 + 1));
  uVar7 = (ulong)((char)local_d8._target == '-');
  bVar22 = *(byte *)((long)&local_d8._target + uVar7);
  if ((bVar22 == 0x30) || (*(char *)((long)&local_d8._target + uVar7 + 1) != '.')) {
    __assert_fail("mantissa[0] != \'0\' && mantissa[1] == \'.\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x203d,
                  "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                 );
  }
  pbVar18 = (byte *)((long)&local_d8._target + uVar7 + 1);
  *pbVar18 = bVar22;
  goto LAB_0012303a;
LAB_00122cb3:
  pbVar12 = pbVar16 + 1;
  bVar22 = *pbVar16;
  if (bVar22 == 0) {
    *pbVar18 = 0;
LAB_00122eac:
    __return_storage_ptr__ = local_b0;
    xpath_string::from_heap_preallocated(local_b0,pbVar9,pbVar18);
LAB_00122ecc:
    xpath_allocator_capture::~xpath_allocator_capture(&local_d8);
    return __return_storage_ptr__;
  }
  pcVar15 = strchr((char *)__s,(uint)bVar22);
  pbVar16 = pbVar12;
  if (pcVar15 != (char *)0x0) goto code_r0x00122cd1;
  goto LAB_00122ce5;
code_r0x00122cd1:
  uVar7 = (long)pcVar15 - __s;
  if (uVar7 < sVar6) {
    bVar22 = *(byte *)((long)local_88 + uVar7);
LAB_00122ce5:
    *pbVar18 = bVar22;
    pbVar18 = pbVar18 + 1;
  }
  goto LAB_00122cb3;
switchD_0012254c_caseD_20:
  this = this->_left;
  goto LAB_00122534;
  while (pbVar12 = pbVar9 + -1, pbVar16 = pbVar9, pbVar9 = pbVar9 + -1, *pbVar12 == 0x30) {
LAB_0012303a:
    pbVar16 = pbVar18;
    if (pbVar9 == pbVar18) break;
  }
  uVar19 = iVar3 + 1;
  *pbVar16 = 0;
  sVar10 = strlen((char *)&local_d8);
  uVar1 = -uVar19;
  if (0 < (int)uVar19) {
    uVar1 = uVar19;
  }
  sVar6 = (ulong)uVar1 + 4 + sVar10;
  pbVar9 = (byte *)xpath_allocator::allocate(this_01,sVar6);
  if (pbVar9 == (byte *)0x0) {
    __return_storage_ptr__->_buffer = "";
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
  }
  else {
    pbVar16 = pbVar9;
    if ((double)local_b0 < 0.0) {
      pbVar16 = pbVar9 + 1;
      *pbVar9 = 0x2d;
    }
    if (iVar3 < 0) {
      *pbVar16 = 0x30;
      pbVar16 = pbVar16 + 1;
    }
    else {
      for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
        bVar22 = *pbVar18;
        if (9 < bVar22 - 0x30 && bVar22 != 0) {
          __assert_fail("*mantissa == 0 || static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x206e,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        bVar2 = bVar22 != 0;
        if (!bVar2) {
          bVar22 = 0x30;
        }
        *pbVar16 = bVar22;
        pbVar18 = pbVar18 + bVar2;
        pbVar16 = pbVar16 + 1;
      }
      uVar19 = 0;
    }
    if (*pbVar18 != 0) {
      *pbVar16 = 0x2e;
      for (; (int)uVar19 < 0; uVar19 = uVar19 + 1) {
        pbVar16 = pbVar16 + 1;
        *pbVar16 = 0x30;
      }
      for (lVar13 = 1; bVar22 = pbVar18[lVar13 + -1], bVar22 != 0; lVar13 = lVar13 + 1) {
        if (9 < bVar22 - 0x30) {
          __assert_fail("static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x2084,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        pbVar16[lVar13] = bVar22;
      }
      pbVar16 = pbVar16 + lVar13;
    }
    if (pbVar9 + sVar6 <= pbVar16) {
      __assert_fail("s < result + result_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x208a,
                    "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                   );
    }
    *pbVar16 = 0;
LAB_00122d4b:
    xpath_string::from_heap_preallocated(__return_storage_ptr__,pbVar9,pbVar16);
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= s_length + 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= s_length + 1) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= s_length + 1 ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

				case xpath_type_number:
					return convert_number_to_string(eval_number(c, stack), stack.result);

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.temp);

					xpath_stack swapped_stack = {stack.temp, stack.result};

					xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
					return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
				}

				default:
					assert(false && "Wrong expression for return type string"); // unreachable
					return xpath_string();
				}
			}
			}
		}